

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::SerializationException::SerializationException<unsigned_short>
          (SerializationException *this,string *msg,unsigned_short params)

{
  string local_30;
  
  Exception::ConstructMessage<unsigned_short>(&local_30,msg,params);
  SerializationException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit SerializationException(const string &msg, ARGS... params)
	    : SerializationException(ConstructMessage(msg, params...)) {
	}